

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void unres_data_diff_rem(unres_data *unres,uint idx)

{
  uint idx_local;
  unres_data *unres_local;
  
  if (unres->diff->type[idx] == LYD_DIFF_DELETED) {
    lyd_free_withsiblings(unres->diff->first[idx]);
    free(unres->diff->second[idx]);
  }
  if (idx < unres->diff_idx - 1) {
    unres->diff->type[idx] = unres->diff->type[unres->diff_idx - 1];
    unres->diff->first[idx] = unres->diff->first[unres->diff_idx - 1];
    unres->diff->second[idx] = unres->diff->second[unres->diff_idx - 1];
  }
  if (unres->diff->type[unres->diff_idx] == LYD_DIFF_END) {
    unres->diff->type[unres->diff_idx - 1] = unres->diff->type[unres->diff_idx];
    unres->diff_idx = unres->diff_idx - 1;
    return;
  }
  __assert_fail("unres->diff->type[unres->diff_idx] == LYD_DIFF_END",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                ,0x1b2f,"void unres_data_diff_rem(struct unres_data *, unsigned int)");
}

Assistant:

void
unres_data_diff_rem(struct unres_data *unres, unsigned int idx)
{
    if (unres->diff->type[idx] == LYD_DIFF_DELETED) {
        lyd_free_withsiblings(unres->diff->first[idx]);
        free(unres->diff->second[idx]);
    }

    /* replace by last real value */
    if (idx < unres->diff_idx - 1) {
        unres->diff->type[idx] = unres->diff->type[unres->diff_idx - 1];
        unres->diff->first[idx] = unres->diff->first[unres->diff_idx - 1];
        unres->diff->second[idx] = unres->diff->second[unres->diff_idx - 1];
    }

    /* move the end */
    assert(unres->diff->type[unres->diff_idx] == LYD_DIFF_END);
    unres->diff->type[unres->diff_idx - 1] = unres->diff->type[unres->diff_idx];
    --unres->diff_idx;
}